

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void renameTableFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  byte *pbVar1;
  byte bVar2;
  sqlite3 *db;
  int iVar3;
  uint uVar4;
  RenameToken *pToken_1;
  char *pcVar5;
  char *zName;
  char *pcVar6;
  i64 iVar7;
  RenameToken *pRVar8;
  TriggerStep *pTVar9;
  RenameToken *pToken_2;
  FKey *pFVar10;
  long lVar11;
  RenameToken **ppRVar12;
  RenameToken *pToken_4;
  RenameToken *pRVar13;
  RenameToken *pRVar14;
  SrcList *pSVar15;
  int iVar16;
  RenameToken *pToken;
  RenameToken *pToken_5;
  long lVar17;
  RenameCtx sCtx;
  Parse sParse;
  RenameCtx local_288;
  sqlite3_context *local_268;
  sqlite3_value **local_260;
  char *local_258;
  sqlite3_xauth local_250;
  char *local_248;
  char *local_240;
  Walker local_238;
  Parse local_208;
  NameContext local_68;
  
  db = context->pOut->db;
  local_240 = (char *)sqlite3ValueText(*argv,'\x01');
  pcVar5 = (char *)sqlite3ValueText(argv[3],'\x01');
  zName = (char *)sqlite3ValueText(argv[4],'\x01');
  pcVar6 = (char *)sqlite3ValueText(argv[5],'\x01');
  iVar7 = sqlite3VdbeIntValue(argv[6]);
  if (pcVar6 == (char *)0x0 || (zName == (char *)0x0 || pcVar5 == (char *)0x0)) {
    return;
  }
  local_250 = db->xAuth;
  db->xAuth = (sqlite3_xauth)0x0;
  local_268 = context;
  local_260 = argv;
  local_258 = pcVar5;
  local_248 = pcVar6;
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  pcVar5 = local_240;
  local_288.pTab = (Table *)0x0;
  local_288.zOld = (char *)0x0;
  local_288.pList = (RenameToken *)0x0;
  local_288.nList = 0;
  local_288.iCol = 0;
  local_288.pTab = sqlite3FindTable(db,zName,local_240);
  local_238.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_238.walkerDepth = 0;
  local_238.eCode = 0;
  local_238._38_2_ = 0;
  local_238.xExprCallback = renameTableExprCb;
  local_238.xSelectCallback = renameTableSelectCb;
  local_238.pParse = &local_208;
  local_238.u.pNC = (NameContext *)&local_288;
  iVar3 = renameParseSql(&local_208,pcVar5,db,local_258,(int)iVar7);
  if (iVar3 != 0) goto LAB_001b94e2;
  uVar4 = (uint)db->flags;
  if (local_208.pNewTable == (Table *)0x0) {
    if (local_208.pNewIndex == (Index *)0x0) {
      pcVar5 = (local_208.pNewTrigger)->table;
      if (pcVar5 != (char *)0x0) {
        lVar11 = 0;
        do {
          bVar2 = pcVar5[lVar11];
          if (bVar2 == zName[lVar11]) {
            if ((ulong)bVar2 == 0) goto LAB_001b92c3;
          }
          else if (""[bVar2] != ""[(byte)zName[lVar11]]) break;
          lVar11 = lVar11 + 1;
        } while( true );
      }
      goto LAB_001b9347;
    }
    pcVar5 = (local_208.pNewIndex)->zName;
    if (local_208.pRename != (RenameToken *)0x0 && pcVar5 != (char *)0x0) {
      if ((char *)(local_208.pRename)->p == pcVar5) {
        ppRVar12 = &local_208.pRename;
        pRVar8 = local_208.pRename;
      }
      else {
        do {
          pRVar8 = local_208.pRename;
          local_208.pRename = pRVar8->pNext;
          if (local_208.pRename == (RenameToken *)0x0) goto LAB_001b9295;
        } while ((char *)(local_208.pRename)->p != pcVar5);
        ppRVar12 = &pRVar8->pNext;
        pRVar8 = local_208.pRename;
      }
      *ppRVar12 = pRVar8->pNext;
      pRVar8->pNext = local_288.pList;
      local_288.nList = local_288.nList + 1;
      local_288.pList = pRVar8;
    }
LAB_001b9295:
    if (((uVar4 >> 0x1a & 1) == 0) && ((local_208.pNewIndex)->pPartIdxWhere != (Expr *)0x0)) {
      walkExpr(&local_238,(local_208.pNewIndex)->pPartIdxWhere);
    }
  }
  else if ((local_208.pNewTable)->eTabType == '\x02') {
    if ((uVar4 >> 0x1a & 1) == 0) {
      local_68.ncFlags = 0;
      local_68._44_4_ = 0;
      local_68.pWinSelect = (Select *)0x0;
      local_68.pNext = (NameContext *)0x0;
      local_68.nRef = 0;
      local_68.nNcErr = 0;
      local_68.pSrcList = (SrcList *)0x0;
      local_68.uNC.pEList = (ExprList *)0x0;
      pbVar1 = (byte *)((long)&(((local_208.pNewTable)->u).view.pSelect)->selFlags + 2);
      *pbVar1 = *pbVar1 & 0xdf;
      local_68.pParse = &local_208;
      sqlite3SelectPrep(&local_208,((local_208.pNewTable)->u).view.pSelect,&local_68);
      if (local_208.nErr == 0) {
        sqlite3WalkSelect(&local_238,((local_208.pNewTable)->u).view.pSelect);
      }
      else {
        iVar3 = local_208.rc;
        if (local_208.rc != 0) goto LAB_001b94e2;
      }
    }
  }
  else {
    if (((((byte)(db->flags >> 0x1a) & 0x3f & (uVar4 >> 0xe & 1) == 0) == 0) &&
        ((local_208.pNewTable)->eTabType != '\x01')) &&
       (pFVar10 = ((local_208.pNewTable)->u).tab.pFKey, pFVar10 != (FKey *)0x0)) {
      pRVar8 = local_288.pList;
      iVar3 = local_288.nList;
LAB_001b90fd:
      pcVar5 = pFVar10->zTo;
      if (pcVar5 != (char *)0x0) {
        lVar11 = 0;
        do {
          bVar2 = pcVar5[lVar11];
          if (bVar2 == zName[lVar11]) {
            if ((ulong)bVar2 == 0) goto LAB_001b912f;
          }
          else if (""[bVar2] != ""[(byte)zName[lVar11]]) break;
          lVar11 = lVar11 + 1;
        } while( true );
      }
      goto LAB_001b9171;
    }
LAB_001b917a:
    pcVar5 = (local_208.pNewTable)->zName;
    if (pcVar5 != (char *)0x0) {
      lVar11 = 0;
      do {
        bVar2 = zName[lVar11];
        if (bVar2 == pcVar5[lVar11]) {
          if ((ulong)bVar2 == 0) goto LAB_001b9202;
        }
        else if (""[bVar2] != ""[(byte)pcVar5[lVar11]]) break;
        lVar11 = lVar11 + 1;
      } while( true );
    }
  }
  goto LAB_001b94c5;
LAB_001b92c3:
  if (local_208.pRename != (RenameToken *)0x0 &&
      (local_288.pTab)->pSchema == (local_208.pNewTrigger)->pTabSchema) {
    pRVar8 = local_208.pRename;
    if ((char *)(local_208.pRename)->p == pcVar5) {
      ppRVar12 = &local_208.pRename;
    }
    else {
      do {
        pRVar14 = pRVar8;
        pRVar8 = pRVar14->pNext;
        if (pRVar8 == (RenameToken *)0x0) goto LAB_001b9347;
      } while ((char *)pRVar8->p != pcVar5);
      ppRVar12 = &pRVar14->pNext;
    }
    *ppRVar12 = pRVar8->pNext;
    pRVar8->pNext = local_288.pList;
    local_288.nList = local_288.nList + 1;
    local_288.pList = pRVar8;
  }
LAB_001b9347:
  if ((uVar4 >> 0x1a & 1) == 0) {
    iVar3 = renameResolveTrigger(&local_208);
    if (iVar3 != 0) goto LAB_001b94e2;
    renameWalkTrigger(&local_238,local_208.pNewTrigger);
    pTVar9 = (local_208.pNewTrigger)->step_list;
    if (pTVar9 != (TriggerStep *)0x0) {
      pRVar8 = local_288.pList;
      iVar3 = local_288.nList;
LAB_001b9397:
      pcVar5 = pTVar9->zTarget;
      if (pcVar5 != (char *)0x0) {
        lVar11 = 0;
        do {
          bVar2 = pcVar5[lVar11];
          if (bVar2 == zName[lVar11]) {
            if ((ulong)bVar2 == 0) goto LAB_001b93c9;
          }
          else if (""[bVar2] != ""[(byte)zName[lVar11]]) break;
          lVar11 = lVar11 + 1;
        } while( true );
      }
      goto LAB_001b940b;
    }
  }
  goto LAB_001b94c5;
LAB_001b93c9:
  if (local_208.pRename != (RenameToken *)0x0) {
    pRVar14 = local_208.pRename;
    ppRVar12 = &local_208.pRename;
    if ((char *)(local_208.pRename)->p != pcVar5) {
      do {
        pRVar13 = pRVar14;
        pRVar14 = pRVar13->pNext;
        if (pRVar14 == (RenameToken *)0x0) goto LAB_001b940b;
      } while ((char *)pRVar14->p != pcVar5);
      ppRVar12 = &pRVar13->pNext;
    }
    *ppRVar12 = pRVar14->pNext;
    pRVar14->pNext = pRVar8;
    iVar3 = iVar3 + 1;
    local_288.nList = iVar3;
    pRVar8 = pRVar14;
    local_288.pList = pRVar14;
  }
LAB_001b940b:
  pSVar15 = pTVar9->pFrom;
  if ((pSVar15 != (SrcList *)0x0) && (iVar16 = pSVar15->nSrc, 0 < iVar16)) {
    lVar11 = 0;
LAB_001b9427:
    pcVar5 = pSVar15->a[lVar11].zName;
    if (pcVar5 != (char *)0x0) {
      lVar17 = 0;
      do {
        bVar2 = pcVar5[lVar17];
        if (bVar2 == zName[lVar17]) {
          if ((ulong)bVar2 == 0) goto LAB_001b945f;
        }
        else if (""[bVar2] != ""[(byte)zName[lVar17]]) break;
        lVar17 = lVar17 + 1;
      } while( true );
    }
    goto LAB_001b94a9;
  }
LAB_001b94b8:
  pTVar9 = pTVar9->pNext;
  if (pTVar9 == (TriggerStep *)0x0) goto LAB_001b94c5;
  goto LAB_001b9397;
LAB_001b945f:
  if (local_208.pRename != (RenameToken *)0x0) {
    ppRVar12 = &local_208.pRename;
    pRVar14 = local_208.pRename;
    if ((char *)(local_208.pRename)->p != pcVar5) {
      do {
        pRVar13 = pRVar14;
        pRVar14 = pRVar13->pNext;
        if (pRVar14 == (RenameToken *)0x0) goto LAB_001b94a9;
      } while ((char *)pRVar14->p != pcVar5);
      ppRVar12 = &pRVar13->pNext;
    }
    *ppRVar12 = pRVar14->pNext;
    pRVar14->pNext = pRVar8;
    iVar3 = iVar3 + 1;
    local_288.nList = iVar3;
    pSVar15 = pTVar9->pFrom;
    iVar16 = pSVar15->nSrc;
    pRVar8 = pRVar14;
    local_288.pList = pRVar14;
  }
LAB_001b94a9:
  lVar11 = lVar11 + 1;
  if (iVar16 <= lVar11) goto LAB_001b94b8;
  goto LAB_001b9427;
LAB_001b912f:
  if (local_208.pRename != (RenameToken *)0x0) {
    pRVar14 = local_208.pRename;
    ppRVar12 = &local_208.pRename;
    if ((char *)(local_208.pRename)->p != pcVar5) {
      do {
        pRVar13 = pRVar14;
        pRVar14 = pRVar13->pNext;
        if (pRVar14 == (RenameToken *)0x0) goto LAB_001b9171;
      } while ((char *)pRVar14->p != pcVar5);
      ppRVar12 = &pRVar13->pNext;
    }
    *ppRVar12 = pRVar14->pNext;
    pRVar14->pNext = pRVar8;
    iVar3 = iVar3 + 1;
    local_288.nList = iVar3;
    pRVar8 = pRVar14;
    local_288.pList = pRVar14;
  }
LAB_001b9171:
  pFVar10 = pFVar10->pNextFrom;
  if (pFVar10 == (FKey *)0x0) goto LAB_001b917a;
  goto LAB_001b90fd;
LAB_001b9202:
  local_288.pTab = local_208.pNewTable;
  if ((uVar4 >> 0x1a & 1) == 0) {
    sqlite3WalkExprList(&local_238,(local_208.pNewTable)->pCheck);
    pcVar5 = (local_208.pNewTable)->zName;
  }
  if (local_208.pRename != (RenameToken *)0x0 && pcVar5 != (char *)0x0) {
    if ((char *)(local_208.pRename)->p == pcVar5) {
      ppRVar12 = &local_208.pRename;
      pRVar8 = local_208.pRename;
    }
    else {
      do {
        pRVar8 = local_208.pRename;
        local_208.pRename = pRVar8->pNext;
        if (local_208.pRename == (RenameToken *)0x0) goto LAB_001b94c5;
      } while ((char *)(local_208.pRename)->p != pcVar5);
      ppRVar12 = &pRVar8->pNext;
      pRVar8 = local_208.pRename;
    }
    *ppRVar12 = pRVar8->pNext;
    pRVar8->pNext = local_288.pList;
    local_288.nList = local_288.nList + 1;
    local_288.pList = pRVar8;
  }
LAB_001b94c5:
  iVar3 = renameEditSql(local_268,&local_288,local_258,local_248,1);
LAB_001b94e2:
  if (iVar3 != 0) {
    if ((iVar3 == 1) && ((db->flags & 0x10000001) == 1)) {
      sqlite3_result_value(local_268,local_260[3]);
    }
    else if (local_208.zErrMsg == (char *)0x0) {
      sqlite3_result_error_code(local_268,iVar3);
    }
    else {
      renameColumnParseError(local_268,"",local_260[1],local_260[2],&local_208);
    }
  }
  renameParseCleanup(&local_208);
  pRVar8 = local_288.pList;
  while (pRVar8 != (RenameToken *)0x0) {
    pRVar14 = pRVar8->pNext;
    sqlite3DbFreeNN(db,pRVar8);
    pRVar8 = pRVar14;
  }
  if (db->noSharedCache == '\0') {
    btreeLeaveAll(db);
  }
  db->xAuth = local_250;
  return;
}

Assistant:

static void renameTableFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zDb = (const char*)sqlite3_value_text(argv[0]);
  const char *zInput = (const char*)sqlite3_value_text(argv[3]);
  const char *zOld = (const char*)sqlite3_value_text(argv[4]);
  const char *zNew = (const char*)sqlite3_value_text(argv[5]);
  int bTemp = sqlite3_value_int(argv[6]);
  UNUSED_PARAMETER(NotUsed);

  if( zInput && zOld && zNew ){
    Parse sParse;
    int rc;
    int bQuote = 1;
    RenameCtx sCtx;
    Walker sWalker;

#ifndef SQLITE_OMIT_AUTHORIZATION
    sqlite3_xauth xAuth = db->xAuth;
    db->xAuth = 0;
#endif

    sqlite3BtreeEnterAll(db);

    memset(&sCtx, 0, sizeof(RenameCtx));
    sCtx.pTab = sqlite3FindTable(db, zOld, zDb);
    memset(&sWalker, 0, sizeof(Walker));
    sWalker.pParse = &sParse;
    sWalker.xExprCallback = renameTableExprCb;
    sWalker.xSelectCallback = renameTableSelectCb;
    sWalker.u.pRename = &sCtx;

    rc = renameParseSql(&sParse, zDb, db, zInput, bTemp);

    if( rc==SQLITE_OK ){
      int isLegacy = (db->flags & SQLITE_LegacyAlter);
      if( sParse.pNewTable ){
        Table *pTab = sParse.pNewTable;

        if( IsView(pTab) ){
          if( isLegacy==0 ){
            Select *pSelect = pTab->u.view.pSelect;
            NameContext sNC;
            memset(&sNC, 0, sizeof(sNC));
            sNC.pParse = &sParse;

            assert( pSelect->selFlags & SF_View );
            pSelect->selFlags &= ~SF_View;
            sqlite3SelectPrep(&sParse, pTab->u.view.pSelect, &sNC);
            if( sParse.nErr ){
              rc = sParse.rc;
            }else{
              sqlite3WalkSelect(&sWalker, pTab->u.view.pSelect);
            }
          }
        }else{
          /* Modify any FK definitions to point to the new table. */
#ifndef SQLITE_OMIT_FOREIGN_KEY
          if( (isLegacy==0 || (db->flags & SQLITE_ForeignKeys))
           && !IsVirtual(pTab)
          ){
            FKey *pFKey;
            assert( IsOrdinaryTable(pTab) );
            for(pFKey=pTab->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
              if( sqlite3_stricmp(pFKey->zTo, zOld)==0 ){
                renameTokenFind(&sParse, &sCtx, (void*)pFKey->zTo);
              }
            }
          }
#endif

          /* If this is the table being altered, fix any table refs in CHECK
          ** expressions. Also update the name that appears right after the
          ** "CREATE [VIRTUAL] TABLE" bit. */
          if( sqlite3_stricmp(zOld, pTab->zName)==0 ){
            sCtx.pTab = pTab;
            if( isLegacy==0 ){
              sqlite3WalkExprList(&sWalker, pTab->pCheck);
            }
            renameTokenFind(&sParse, &sCtx, pTab->zName);
          }
        }
      }

      else if( sParse.pNewIndex ){
        renameTokenFind(&sParse, &sCtx, sParse.pNewIndex->zName);
        if( isLegacy==0 ){
          sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
        }
      }

#ifndef SQLITE_OMIT_TRIGGER
      else{
        Trigger *pTrigger = sParse.pNewTrigger;
        TriggerStep *pStep;
        if( 0==sqlite3_stricmp(sParse.pNewTrigger->table, zOld)
            && sCtx.pTab->pSchema==pTrigger->pTabSchema
          ){
          renameTokenFind(&sParse, &sCtx, sParse.pNewTrigger->table);
        }

        if( isLegacy==0 ){
          rc = renameResolveTrigger(&sParse);
          if( rc==SQLITE_OK ){
            renameWalkTrigger(&sWalker, pTrigger);
            for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
              if( pStep->zTarget && 0==sqlite3_stricmp(pStep->zTarget, zOld) ){
                renameTokenFind(&sParse, &sCtx, pStep->zTarget);
              }
              if( pStep->pFrom ){
                int i;
                for(i=0; i<pStep->pFrom->nSrc; i++){
                  SrcItem *pItem = &pStep->pFrom->a[i];
                  if( 0==sqlite3_stricmp(pItem->zName, zOld) ){
                    renameTokenFind(&sParse, &sCtx, pItem->zName);
                  }
                }
              }
            }
          }
        }
      }
#endif
    }

    if( rc==SQLITE_OK ){
      rc = renameEditSql(context, &sCtx, zInput, zNew, bQuote);
    }
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_ERROR && sqlite3WritableSchema(db) ){
        sqlite3_result_value(context, argv[3]);
      }else if( sParse.zErrMsg ){
        renameColumnParseError(context, "", argv[1], argv[2], &sParse);
      }else{
        sqlite3_result_error_code(context, rc);
      }
    }

    renameParseCleanup(&sParse);
    renameTokenFree(db, sCtx.pList);
    sqlite3BtreeLeaveAll(db);
#ifndef SQLITE_OMIT_AUTHORIZATION
    db->xAuth = xAuth;
#endif
  }

  return;
}